

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_detection.cpp
# Opt level: O2

void duckdb::CSVSniffer::SetDateFormat
               (CSVStateMachine *candidate,string *format_specifier,LogicalTypeId *sql_type)

{
  mapped_type *this;
  StrpTimeFormat strpformat;
  string local_130;
  StrTimeFormat local_110;
  StrTimeFormat local_98;
  
  StrpTimeFormat::StrpTimeFormat((StrpTimeFormat *)&local_98);
  StrTimeFormat::ParseFormatSpecifier(&local_130,format_specifier,&local_98);
  ::std::__cxx11::string::~string((string *)&local_130);
  this = ::std::
         map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
         ::operator[](&(candidate->dialect_options).date_format,sql_type);
  StrpTimeFormat::StrpTimeFormat((StrpTimeFormat *)&local_110,(StrpTimeFormat *)&local_98);
  CSVOption<duckdb::StrpTimeFormat>::Set(this,(StrpTimeFormat *)&local_110,false);
  StrTimeFormat::~StrTimeFormat(&local_110);
  StrTimeFormat::~StrTimeFormat(&local_98);
  return;
}

Assistant:

void CSVSniffer::SetDateFormat(CSVStateMachine &candidate, const string &format_specifier,
                               const LogicalTypeId &sql_type) {
	StrpTimeFormat strpformat;
	StrTimeFormat::ParseFormatSpecifier(format_specifier, strpformat);
	candidate.dialect_options.date_format[sql_type].Set(strpformat, false);
}